

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O3

SRes Flush(CLzmaEnc *p,UInt32 nowPos)

{
  CRangeEnc *p_00;
  SRes SVar1;
  int iVar2;
  uint uVar3;
  UInt32 m;
  ulong uVar4;
  UInt32 m_1;
  uint uVar5;
  bool bVar6;
  
  p->finished = 1;
  if (p->writeEndMark != 0) {
    uVar5 = nowPos & p->pbMask;
    p_00 = &p->rc;
    uVar4 = 1;
    RangeEnc_EncodeBit(p_00,p->isMatch[p->state] + uVar5,1);
    RangeEnc_EncodeBit(p_00,p->isRep + p->state,0);
    p->state = kMatchNextStates[p->state];
    LenEnc_Encode2(&p->lenEnc,p_00,0,uVar5,(uint)(p->fastMode == 0),p->ProbPrices);
    uVar5 = 5;
    do {
      bVar6 = (0x3fU >> (uVar5 & 0x1f) & 1) != 0;
      RangeEnc_EncodeBit(p_00,p->posSlotEncoder[0] + uVar4,(uint)bVar6);
      uVar4 = (ulong)((uint)bVar6 + (int)uVar4 * 2);
      bVar6 = uVar5 != 0;
      uVar5 = uVar5 - 1;
    } while (bVar6);
    RangeEnc_EncodeDirectBits(p_00,0x3ffffff,0x1a);
    uVar5 = 1;
    uVar3 = 0xf;
    iVar2 = 4;
    do {
      RangeEnc_EncodeBit(p_00,p->posAlignEncoder + uVar5,uVar3 & 1);
      uVar5 = (uVar3 & 1) + uVar5 * 2;
      uVar3 = uVar3 >> 1;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  iVar2 = 5;
  do {
    RangeEnc_ShiftLow(&p->rc);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  RangeEnc_FlushStream(&p->rc);
  if (p->result != 0) {
    return p->result;
  }
  if ((p->rc).res == 0) {
    if ((p->matchFinderBase).result == 0) {
      return 0;
    }
  }
  else {
    p->result = 9;
    if ((p->matchFinderBase).result == 0) {
      SVar1 = 9;
      goto LAB_00113b46;
    }
  }
  p->result = 8;
  SVar1 = 8;
LAB_00113b46:
  p->finished = 1;
  return SVar1;
}

Assistant:

static SRes Flush(CLzmaEnc *p, UInt32 nowPos)
{
  /* ReleaseMFStream(); */
  p->finished = True;
  if (p->writeEndMark)
    WriteEndMarker(p, nowPos & p->pbMask);
  RangeEnc_FlushData(&p->rc);
  RangeEnc_FlushStream(&p->rc);
  return CheckErrors(p);
}